

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O2

ps_search_t *
ngram_search_init(char *name,ngram_model_t *lm,cmd_ln_t *config,acmod_t *acmod,dict_t *dict,
                 dict2pid_t *d2p)

{
  int iVar1;
  int32 iVar2;
  int32 iVar3;
  ngram_search_t *ngs;
  hmm_context_t *phVar4;
  listelem_alloc_t *plVar5;
  chan_t **ppcVar6;
  int32 *piVar7;
  bitvec_t *pbVar8;
  last_ltrans_t *plVar9;
  long lVar10;
  bptbl_t *pbVar11;
  void *pvVar12;
  int32 **ppiVar13;
  ngram_model_t *model;
  uint grow_feat;
  size_t n_elem;
  ngram_model_t *lm_local;
  
  lm_local = lm;
  iVar1 = ps_config_bool(config,"fwdflat");
  if (iVar1 == 0) {
    grow_feat = 0;
  }
  else {
    iVar1 = ps_config_bool(config,"fwdtree");
    grow_feat = (uint)(iVar1 != 0);
  }
  acmod_set_grow(acmod,grow_feat);
  ngs = (ngram_search_t *)
        __ckd_calloc__(1,0x2c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                       ,0x96);
  ps_search_init((ps_search_t *)ngs,&ngram_funcs,"ngram",name,config,acmod,dict,d2p);
  phVar4 = hmm_context_init(acmod->mdef->n_emit_state,acmod->tmat->tp,(int16 *)0x0,acmod->mdef->sseq
                           );
  ngs->hmmctx = phVar4;
  if (phVar4 == (hmm_context_t *)0x0) {
    (*((ngs->base).vt)->free)((ps_search_t *)ngs);
  }
  else {
    plVar5 = listelem_alloc_init(0x70);
    ngs->chan_alloc = plVar5;
    plVar5 = listelem_alloc_init(0x70);
    ngs->root_chan_alloc = plVar5;
    plVar5 = listelem_alloc_init(0x48);
    ngs->latnode_alloc = plVar5;
    ngram_search_calc_beams(ngs);
    ppcVar6 = (chan_t **)
              __ckd_calloc__((long)dict->n_word,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                             ,0xa8);
    ngs->word_chan = ppcVar6;
    piVar7 = (int32 *)__ckd_calloc__((long)dict->n_word,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                     ,0xaa);
    ngs->word_lat_idx = piVar7;
    pbVar8 = (bitvec_t *)
             __ckd_calloc__((long)((dict->n_word + 0x1f) / 0x20),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                            ,0xab);
    ngs->word_active = pbVar8;
    plVar9 = (last_ltrans_t *)
             __ckd_calloc__((long)dict->n_word,0xc,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                            ,0xad);
    ngs->last_ltrans = plVar9;
    lVar10 = ps_config_int(config,"latsize");
    ngs->bp_table_size = (int)lVar10;
    pbVar11 = (bptbl_t *)
              __ckd_calloc__((long)(int)lVar10,0x24,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                             ,0xb3);
    ngs->bp_table = pbVar11;
    n_elem = (long)ngs->bp_table_size * 0x14;
    ngs->bscore_stack_size = (int32)n_elem;
    piVar7 = (int32 *)__ckd_calloc__(n_elem,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                     ,0xb7);
    ngs->bscore_stack = piVar7;
    ngs->n_frame_alloc = 0x100;
    pvVar12 = __ckd_calloc__(0x101,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                             ,0xba);
    ngs->bp_table_idx = (int32 *)((long)pvVar12 + 4);
    ppiVar13 = (int32 **)
               __ckd_calloc_2d__(2,(long)dict->n_word,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                 ,0xbf);
    ngs->active_word_list = ppiVar13;
    model = ngram_model_set_init(config,&lm_local,&ngram_search_init::lmname,(float32 *)0x0,1);
    ngs->lmset = model;
    if (model != (ngram_model_t *)0x0) {
      iVar2 = ngram_wid(model,"</s>");
      iVar3 = ngram_unknown_wid(ngs->lmset);
      if (iVar2 != iVar3) {
        ngram_search_update_widmap(ngs);
        iVar1 = ps_config_bool(config,"fwdtree");
        if (iVar1 != 0) {
          ngram_fwdtree_init(ngs);
          ngs->fwdtree = '\x01';
          (ngs->fwdtree_perf).name = "fwdtree";
          ptmr_init(&ngs->fwdtree_perf);
        }
        iVar1 = ps_config_bool(config,"fwdflat");
        if (iVar1 != 0) {
          ngram_fwdflat_init(ngs);
          ngs->fwdflat = '\x01';
          (ngs->fwdflat_perf).name = "fwdflat";
          ptmr_init(&ngs->fwdflat_perf);
        }
        iVar1 = ps_config_bool(config,"bestpath");
        if (iVar1 == 0) {
          return &ngs->base;
        }
        ngs->bestpath = '\x01';
        (ngs->bestpath_perf).name = "bestpath";
        ptmr_init(&ngs->bestpath_perf);
        return &ngs->base;
      }
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0xc9,"Language model/set does not contain </s>, recognition will fail\n");
    }
    ngram_search_free((ps_search_t *)ngs);
  }
  return (ps_search_t *)0x0;
}

Assistant:

ps_search_t *
ngram_search_init(const char *name,
                  ngram_model_t *lm,
                  cmd_ln_t *config,
                  acmod_t *acmod,
                  dict_t *dict,
                  dict2pid_t *d2p)
{
    ngram_search_t *ngs;
    static char *lmname = "default";

    /* Make the acmod's feature buffer growable if we are doing two-pass
     * search. */
    acmod_set_grow(acmod, ps_config_bool(config, "fwdflat") &&
                          ps_config_bool(config, "fwdtree"));

    ngs = ckd_calloc(1, sizeof(*ngs));
    ps_search_init(&ngs->base, &ngram_funcs, PS_SEARCH_TYPE_NGRAM, name, config, acmod, dict, d2p);

    ngs->hmmctx = hmm_context_init(bin_mdef_n_emit_state(acmod->mdef),
                                   acmod->tmat->tp, NULL, acmod->mdef->sseq);
    if (ngs->hmmctx == NULL) {
        ps_search_free(ps_search_base(ngs));
        return NULL;
    }
    ngs->chan_alloc = listelem_alloc_init(sizeof(chan_t));
    ngs->root_chan_alloc = listelem_alloc_init(sizeof(root_chan_t));
    ngs->latnode_alloc = listelem_alloc_init(sizeof(ps_latnode_t));

    /* Calculate various beam widths and such. */
    ngram_search_calc_beams(ngs);

    /* Allocate a billion different tables for stuff. */
    ngs->word_chan = ckd_calloc(dict_size(dict),
                                sizeof(*ngs->word_chan));
    ngs->word_lat_idx = ckd_calloc(dict_size(dict),
                                   sizeof(*ngs->word_lat_idx));
    ngs->word_active = bitvec_alloc(dict_size(dict));
    ngs->last_ltrans = ckd_calloc(dict_size(dict),
                                  sizeof(*ngs->last_ltrans));

    /* FIXME: All these structures need to be made dynamic with
     * garbage collection. */
    ngs->bp_table_size = ps_config_int(config, "latsize");
    ngs->bp_table = ckd_calloc(ngs->bp_table_size,
                               sizeof(*ngs->bp_table));
    /* FIXME: This thing is frickin' huge. */
    ngs->bscore_stack_size = ngs->bp_table_size * 20;
    ngs->bscore_stack = ckd_calloc(ngs->bscore_stack_size,
                                   sizeof(*ngs->bscore_stack));
    ngs->n_frame_alloc = 256;
    ngs->bp_table_idx = ckd_calloc(ngs->n_frame_alloc + 1,
                                   sizeof(*ngs->bp_table_idx));
    ++ngs->bp_table_idx; /* Make bptableidx[-1] valid */

    /* Allocate active word list array */
    ngs->active_word_list = ckd_calloc_2d(2, dict_size(dict),
                                          sizeof(**ngs->active_word_list));

    ngs->lmset = ngram_model_set_init(config, &lm, &lmname, NULL, 1);
    if (!ngs->lmset)
        goto error_out;

    if (ngram_wid(ngs->lmset, S3_FINISH_WORD) ==
        ngram_unknown_wid(ngs->lmset))
    {
        E_ERROR("Language model/set does not contain </s>, "
                "recognition will fail\n");
        goto error_out;
    }

    /* Create word mappings. */
    ngram_search_update_widmap(ngs);

    /* Initialize fwdtree, fwdflat, bestpath modules if necessary. */
    if (ps_config_bool(config, "fwdtree")) {
        ngram_fwdtree_init(ngs);
        ngs->fwdtree = TRUE;
        ngs->fwdtree_perf.name = "fwdtree";
        ptmr_init(&ngs->fwdtree_perf);
    }
    if (ps_config_bool(config, "fwdflat")) {
        ngram_fwdflat_init(ngs);
        ngs->fwdflat = TRUE;
        ngs->fwdflat_perf.name = "fwdflat";
        ptmr_init(&ngs->fwdflat_perf);
    }
    if (ps_config_bool(config, "bestpath")) {
        ngs->bestpath = TRUE;
        ngs->bestpath_perf.name = "bestpath";
        ptmr_init(&ngs->bestpath_perf);
    }

    return (ps_search_t *)ngs;

error_out:
    ngram_search_free((ps_search_t *)ngs);
    return NULL;
}